

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter_enc.c
# Opt level: O3

void av1_build_wedge_inter_predictor_from_buf
               (MACROBLOCKD *xd,BLOCK_SIZE bsize,int plane_from,int plane_to,uint8_t **ext_dst0,
               int *ext_dst_stride0,uint8_t **ext_dst1,int *ext_dst_stride1)

{
  BLOCK_SIZE BVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  DIFFWTD_MASK_TYPE DVar5;
  byte bVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  uint32_t uVar9;
  int iVar10;
  uint8_t *puVar11;
  MB_MODE_INFO *pMVar12;
  uint uVar13;
  _func_void_uint8_t_ptr_ptrdiff_t_uint8_t_ptr_ptrdiff_t_int_int **pp_Var14;
  uint8_t *puVar15;
  int plane;
  uint16_t *puVar16;
  long lVar17;
  uint16_t *puVar18;
  long lVar19;
  int *piVar20;
  
  if (plane_from <= plane_to) {
    lVar17 = (long)plane_from;
    piVar20 = &xd->plane[lVar17].dst.stride;
    lVar19 = 0;
    do {
      BVar1 = av1_ss_size_lookup[bsize][piVar20[-9]][piVar20[-8]];
      bVar2 = block_size_wide[BVar1];
      bVar3 = block_size_high[BVar1];
      puVar18 = (uint16_t *)ext_dst0[lVar17 + lVar19];
      uVar7 = ext_dst_stride0[lVar17 + lVar19];
      puVar11 = ext_dst1[lVar17 + lVar19];
      uVar8 = ext_dst_stride1[lVar17 + lVar19];
      pMVar12 = *xd->mi;
      puVar16 = (uint16_t *)((buf_2d *)(piVar20 + -6))->buf;
      puVar15 = xd->seg_mask;
      (pMVar12->interinter_comp).seg_mask = puVar15;
      uVar13 = (uint)xd->cur_buf->flags >> 3;
      if ((pMVar12->ref_frame[1] < '\x01') ||
         (bVar4 = (pMVar12->interinter_comp).type, (bVar4 & 0xfe) != 2)) {
        if ((uVar13 & 1) == 0) {
          uVar8 = *piVar20;
          pp_Var14 = &aom_convolve_copy;
        }
        else {
          puVar18 = (uint16_t *)((long)puVar18 * 2);
          puVar16 = (uint16_t *)((long)puVar16 * 2);
          uVar8 = *piVar20;
          pp_Var14 = (_func_void_uint8_t_ptr_ptrdiff_t_uint8_t_ptr_ptrdiff_t_int_int **)
                     &aom_highbd_convolve_copy;
        }
        (**pp_Var14)(puVar18,(long)(int)uVar7,puVar16,(long)(int)uVar8,(uint)bVar2,(uint)bVar3);
      }
      else {
        if ((-lVar17 == lVar19) && (bVar4 == 3)) {
          DVar5 = (pMVar12->interinter_comp).mask_type;
          if ((uVar13 & 1) == 0) {
            (*av1_build_compound_diffwtd_mask)
                      (puVar15,DVar5,(uint8_t *)puVar18,uVar7,puVar11,uVar8,(uint)bVar3,(uint)bVar2)
            ;
LAB_002346e4:
            BVar1 = pMVar12->bsize;
            bVar4 = ""[BVar1];
            bVar6 = ""[BVar1];
            uVar9 = *piVar20;
            puVar15 = av1_get_compound_type_mask(&pMVar12->interinter_comp,BVar1);
            (*aom_blend_a64_mask)
                      ((uint8_t *)puVar16,uVar9,(uint8_t *)puVar18,uVar7,puVar11,uVar8,puVar15,
                       (uint)block_size_wide[BVar1],(uint)bVar2,(uint)bVar3,
                       (uint)(2 << (bVar6 & 0x1f) == (uint)bVar2),
                       (uint)(2 << (bVar4 & 0x1f) == (uint)bVar3));
            goto LAB_002346ba;
          }
          (*av1_build_compound_diffwtd_mask_highbd)
                    (puVar15,DVar5,(uint8_t *)((ulong)puVar18 >> 1),uVar7,
                     (uint8_t *)((ulong)puVar11 >> 1),uVar8,(uint)bVar3,(uint)bVar2,xd->bd);
        }
        else if ((uVar13 & 1) == 0) goto LAB_002346e4;
        uVar9 = *piVar20;
        BVar1 = pMVar12->bsize;
        bVar4 = ""[BVar1];
        bVar6 = ""[BVar1];
        iVar10 = xd->bd;
        puVar15 = av1_get_compound_type_mask(&pMVar12->interinter_comp,BVar1);
        (*aom_highbd_blend_a64_mask)
                  ((uint8_t *)puVar16,uVar9,(uint8_t *)((ulong)puVar18 >> 1),uVar7,
                   (uint8_t *)((ulong)puVar11 >> 1),uVar8,puVar15,(uint)block_size_wide[BVar1],
                   (uint)bVar2,(uint)bVar3,(uint)(2 << (bVar6 & 0x1f) == (uint)bVar2),
                   (uint)(2 << (bVar4 & 0x1f) == (uint)bVar3),iVar10);
      }
LAB_002346ba:
      lVar19 = lVar19 + 1;
      piVar20 = piVar20 + 0x28c;
    } while ((plane_to - plane_from) + 1 != (int)lVar19);
  }
  return;
}

Assistant:

void av1_build_wedge_inter_predictor_from_buf(MACROBLOCKD *xd, BLOCK_SIZE bsize,
                                              int plane_from, int plane_to,
                                              uint8_t *ext_dst0[],
                                              int ext_dst_stride0[],
                                              uint8_t *ext_dst1[],
                                              int ext_dst_stride1[]) {
  int plane;
  assert(bsize < BLOCK_SIZES_ALL);
  for (plane = plane_from; plane <= plane_to; ++plane) {
    const BLOCK_SIZE plane_bsize = get_plane_block_size(
        bsize, xd->plane[plane].subsampling_x, xd->plane[plane].subsampling_y);
    const int bw = block_size_wide[plane_bsize];
    const int bh = block_size_high[plane_bsize];
    build_wedge_inter_predictor_from_buf(
        xd, plane, 0, 0, bw, bh, ext_dst0[plane], ext_dst_stride0[plane],
        ext_dst1[plane], ext_dst_stride1[plane]);
  }
}